

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O3

void dasm_free(BuildCtx *ctx)

{
  dasm_State *__ptr;
  int iVar1;
  int **ppiVar2;
  long lVar3;
  
  __ptr = ctx->D;
  iVar1 = __ptr->maxsection;
  if (0 < iVar1) {
    ppiVar2 = &__ptr->sections[0].buf;
    lVar3 = 0;
    do {
      if (*ppiVar2 != (int *)0x0) {
        free(*ppiVar2);
        iVar1 = __ptr->maxsection;
      }
      lVar3 = lVar3 + 1;
      ppiVar2 = ppiVar2 + 5;
    } while (lVar3 < iVar1);
  }
  if (__ptr->pclabels != (int *)0x0) {
    free(__ptr->pclabels);
  }
  if (__ptr->lglabels != (int *)0x0) {
    free(__ptr->lglabels);
  }
  free(__ptr);
  return;
}

Assistant:

void dasm_free(Dst_DECL)
{
  dasm_State *D = Dst_REF;
  int i;
  for (i = 0; i < D->maxsection; i++)
    if (D->sections[i].buf)
      DASM_M_FREE(Dst, D->sections[i].buf, D->sections[i].bsize);
  if (D->pclabels) DASM_M_FREE(Dst, D->pclabels, D->pcsize);
  if (D->lglabels) DASM_M_FREE(Dst, D->lglabels, D->lgsize);
  DASM_M_FREE(Dst, D, D->psize);
}